

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# array_object.cpp
# Opt level: O0

object_ptr __thiscall
mjs::make_array(mjs *this,gc_heap_ptr<mjs::global_object> *global,
               vector<mjs::value,_std::allocator<mjs::value>_> *args)

{
  value_type vVar1;
  uint32_t length;
  global_object *pgVar2;
  size_type sVar3;
  const_reference pvVar4;
  ulong uVar5;
  array_object *paVar6;
  gc_heap *h;
  uint32_t index;
  undefined8 extraout_RDX;
  double n;
  wstring_view wVar7;
  object_ptr oVar8;
  wstring local_b0;
  wstring_view local_90;
  string local_80;
  uint local_6c;
  undefined1 local_68 [4];
  uint32_t i;
  gc_heap_ptr<mjs::array_object> arr;
  undefined1 local_50 [40];
  object_ptr array_prototype;
  vector<mjs::value,_std::allocator<mjs::value>_> *args_local;
  gc_heap_ptr<mjs::global_object> *global_local;
  
  array_prototype.super_gc_heap_ptr_untyped._8_8_ = args;
  pgVar2 = gc_heap_ptr<mjs::global_object>::operator->(global);
  (*(pgVar2->super_object)._vptr_object[0xe])(local_50 + 0x20);
  sVar3 = std::vector<mjs::value,_std::allocator<mjs::value>_>::size
                    ((vector<mjs::value,_std::allocator<mjs::value>_> *)
                     array_prototype.super_gc_heap_ptr_untyped._8_8_);
  if (sVar3 == 1) {
    pvVar4 = std::vector<mjs::value,_std::allocator<mjs::value>_>::operator[]
                       ((vector<mjs::value,_std::allocator<mjs::value>_> *)
                        array_prototype.super_gc_heap_ptr_untyped._8_8_,0);
    vVar1 = value::type(pvVar4);
    if (vVar1 == number) {
      pgVar2 = gc_heap_ptr<mjs::global_object>::operator*(global);
      pvVar4 = std::vector<mjs::value,_std::allocator<mjs::value>_>::operator[]
                         ((vector<mjs::value,_std::allocator<mjs::value>_> *)
                          array_prototype.super_gc_heap_ptr_untyped._8_8_,0);
      n = value::number_value(pvVar4);
      length = anon_unknown_63::check_array_length(pgVar2,n);
      array_object::make((array_object *)local_50,global,length);
      gc_heap_ptr<mjs::object>::gc_heap_ptr<mjs::array_object,void>
                ((gc_heap_ptr<mjs::object> *)this,(gc_heap_ptr<mjs::array_object> *)local_50);
      gc_heap_ptr<mjs::array_object>::~gc_heap_ptr((gc_heap_ptr<mjs::array_object> *)local_50);
      arr.super_gc_heap_ptr_untyped._12_4_ = 1;
      goto LAB_0014733f;
    }
  }
  sVar3 = std::vector<mjs::value,_std::allocator<mjs::value>_>::size
                    ((vector<mjs::value,_std::allocator<mjs::value>_> *)
                     array_prototype.super_gc_heap_ptr_untyped._8_8_);
  array_object::make((array_object *)local_68,global,(uint32_t)sVar3);
  local_6c = 0;
  while( true ) {
    uVar5 = (ulong)local_6c;
    sVar3 = std::vector<mjs::value,_std::allocator<mjs::value>_>::size
                      ((vector<mjs::value,_std::allocator<mjs::value>_> *)
                       array_prototype.super_gc_heap_ptr_untyped._8_8_);
    if (sVar3 <= uVar5) break;
    paVar6 = gc_heap_ptr<mjs::array_object>::operator->((gc_heap_ptr<mjs::array_object> *)local_68);
    h = gc_heap_ptr_untyped::heap(&global->super_gc_heap_ptr_untyped);
    index_string_abi_cxx11_(&local_b0,(mjs *)(ulong)local_6c,index);
    wVar7 = (wstring_view)
            std::__cxx11::wstring::operator_cast_to_basic_string_view((wstring *)&local_b0);
    local_90 = wVar7;
    string::string(&local_80,h,&local_90);
    pvVar4 = std::vector<mjs::value,_std::allocator<mjs::value>_>::operator[]
                       ((vector<mjs::value,_std::allocator<mjs::value>_> *)
                        array_prototype.super_gc_heap_ptr_untyped._8_8_,(ulong)local_6c);
    (*(paVar6->super_native_object).super_object._vptr_object[1])(paVar6,&local_80,pvVar4,0);
    string::~string(&local_80);
    std::__cxx11::wstring::~wstring((wstring *)&local_b0);
    local_6c = local_6c + 1;
  }
  gc_heap_ptr<mjs::object>::gc_heap_ptr<mjs::array_object,void>
            ((gc_heap_ptr<mjs::object> *)this,(gc_heap_ptr<mjs::array_object> *)local_68);
  arr.super_gc_heap_ptr_untyped._12_4_ = 1;
  gc_heap_ptr<mjs::array_object>::~gc_heap_ptr((gc_heap_ptr<mjs::array_object> *)local_68);
LAB_0014733f:
  gc_heap_ptr<mjs::object>::~gc_heap_ptr((gc_heap_ptr<mjs::object> *)(local_50 + 0x20));
  oVar8.super_gc_heap_ptr_untyped._8_8_ = extraout_RDX;
  oVar8.super_gc_heap_ptr_untyped.heap_ = (gc_heap *)this;
  return (object_ptr)oVar8.super_gc_heap_ptr_untyped;
}

Assistant:

object_ptr make_array(const gc_heap_ptr<global_object>& global, const std::vector<value>& args) {
    auto array_prototype = global->array_prototype();
    if (args.size() == 1 && args[0].type() == value_type::number) {
        return array_object::make(global, check_array_length(*global, args[0].number_value()));
    }
    auto arr = array_object::make(global, static_cast<uint32_t>(args.size()));
    for (uint32_t i = 0; i < args.size(); ++i) {
        arr->put(string{global.heap(), index_string(i)}, args[i], property_attribute::none);
    }
    return arr;
}